

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::Optimize(GlobOpt *this)

{
  BVSparseNode **this_00;
  bool bVar1;
  ArgSlot AVar2;
  SymID SVar3;
  JITTimeFunctionBody *this_01;
  BVSparse<Memory::JitArenaAllocator> **ppBVar4;
  PageAllocator *pageAllocator_00;
  undefined1 local_158 [8];
  NoRecoverMemoryJitArenaAllocator localTempAlloc;
  NoRecoverMemoryJitArenaAllocator localAlloc;
  PageAllocator *pageAllocator;
  int local_34;
  BVSparse<Memory::JitArenaAllocator> *local_30;
  int local_24;
  BVSparse<Memory::JitArenaAllocator> *local_20;
  int local_14;
  GlobOpt *local_10;
  GlobOpt *this_local;
  
  this->objectTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  local_10 = this;
  AVar2 = Func::GetInParamsCount(this->func);
  this->func->argInsCount = AVar2;
  this_01 = Func::GetJITFunctionBody(this->func);
  bVar1 = JITTimeFunctionBody::IsAsmJsMode(this_01);
  if (!bVar1) {
    this->func->argInsCount = this->func->argInsCount - 1;
  }
  bVar1 = Func::DoGlobOpt(this->func);
  if (bVar1) {
    local_14 = 0xd1;
    local_20 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    ppBVar4 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Lookup(this->func->m_symTable->m_propertyEquivBvMap,&local_14,&local_20);
    this->lengthEquivBv = *ppBVar4;
    local_24 = 0x1cf;
    local_30 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    ppBVar4 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Lookup(this->func->m_symTable->m_propertyEquivBvMap,&local_24,&local_30);
    this->argumentsEquivBv = *ppBVar4;
    local_34 = 0x1cd;
    pageAllocator = (PageAllocator *)0x0;
    ppBVar4 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Lookup(this->func->m_symTable->m_propertyEquivBvMap,&local_34,
                       (BVSparse<Memory::JitArenaAllocator> **)&pageAllocator);
    this->callerEquivBv = *ppBVar4;
    pageAllocator_00 =
         Memory::ArenaData::GetPageAllocator
                   (&(this->func->m_alloc->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData);
    this_00 = &localTempAlloc.super_JitArenaAllocator.bvFreeList;
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)this_00,L"BE-GlobOpt",pageAllocator_00,
               Js::Throw::OutOfMemory);
    this->alloc = (JitArenaAllocator *)this_00;
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_158,L"BE-GlobOpt temp",pageAllocator_00,
               Js::Throw::OutOfMemory);
    this->tempAlloc = (JitArenaAllocator *)local_158;
    SVar3 = SymTable::GetMaxSymID(this->func->m_symTable);
    this->maxInitialSymID = SVar3;
    BackwardPass(this,CaptureByteCodeRegUsePhase);
    BackwardPass(this,BackwardPhase);
    ForwardPass(this);
    BackwardPass(this,DeadStorePhase);
    Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_158);
    Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)
               &localTempAlloc.super_JitArenaAllocator.bvFreeList);
    TailDupPass(this);
  }
  else {
    this->lengthEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this->argumentsEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this->callerEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    BackwardPass(this,DeadStorePhase);
    CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::Optimize()
{
    this->objectTypeSyms = nullptr;

    this->func->argInsCount = this->func->GetInParamsCount();
    if (!func->GetJITFunctionBody()->IsAsmJsMode())
    {
        // Don't include "this" pointer in the count when not in AsmJs mode (AsmJS does not have "this").
        this->func->argInsCount--;
    }

    if (!func->DoGlobOpt())
    {
        this->lengthEquivBv = nullptr;
        this->argumentsEquivBv = nullptr;
        this->callerEquivBv = nullptr;

        // Still need to run the dead store phase to calculate the live reg on back edge
        this->BackwardPass(Js::DeadStorePhase);
        CannotAllocateArgumentsObjectOnStack(nullptr);
        return;
    }

    {
        this->lengthEquivBv = this->func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::length, nullptr); // Used to kill live "length" properties
        this->argumentsEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::arguments, nullptr); // Used to kill live "arguments" properties
        this->callerEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::caller, nullptr); // Used to kill live "caller" properties

        // The backward phase needs the glob opt's allocator to allocate the propertyTypeValueMap
        // in GlobOpt::EnsurePropertyTypeValue and ranges of instructions where int overflow may be ignored.
        // (see BackwardPass::TrackIntUsage)
        PageAllocator * pageAllocator = this->func->m_alloc->GetPageAllocator();
        NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-GlobOpt"), pageAllocator, Js::Throw::OutOfMemory);
        this->alloc = &localAlloc;

        NoRecoverMemoryJitArenaAllocator localTempAlloc(_u("BE-GlobOpt temp"), pageAllocator, Js::Throw::OutOfMemory);
        this->tempAlloc = &localTempAlloc;

        // The forward passes use info (upwardExposedUses) from the backward pass. This info
        // isn't available for some of the symbols created during the backward pass, or the forward pass.
        // Keep track of the last symbol for which we're guaranteed to have data.
        this->maxInitialSymID = this->func->m_symTable->GetMaxSymID();
#if DBG
        this->BackwardPass(Js::CaptureByteCodeRegUsePhase);
#endif
        this->BackwardPass(Js::BackwardPhase);
        this->ForwardPass();
        this->BackwardPass(Js::DeadStorePhase);
    }
    this->TailDupPass();
}